

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void __thiscall
duckdb::DataTable::Update
          (DataTable *this,TableUpdateState *state,ClientContext *context,Vector *row_ids,
          vector<duckdb::PhysicalIndex,_true> *column_ids,DataChunk *updates)

{
  TransactionData transaction;
  type state_00;
  idx_t count_p;
  DuckTransaction *pDVar1;
  LocalStorage *this_00;
  RowGroupCollection *this_01;
  TransactionException *this_02;
  DataTableInfo *this_03;
  idx_t iVar2;
  SelectionVector sel_local_update;
  SelectionVector sel_global_update;
  DataChunk updates_slice;
  Vector row_ids_slice;
  Vector max_row_id_vec;
  SelectionVector local_1e0;
  SelectionVector local_1c8;
  LogicalType local_1b0;
  DataChunk local_198;
  undefined1 local_158 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  TransactionData local_f0;
  Vector local_d8;
  string local_70;
  string local_50;
  
  DataChunk::Verify(updates);
  iVar2 = updates->count;
  if (iVar2 != 0) {
    if ((this->version)._M_i != MAIN_TABLE) {
      this_02 = (TransactionException *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = &local_d8.type.type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,
                 "Transaction conflict: attempting to update table \"%s\" but it has been %s by a different transaction"
                 ,"");
      this_03 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
      DataTableInfo::GetTableName_abi_cxx11_(&local_50,this_03);
      TableModification_abi_cxx11_(&local_70,this);
      TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
                (this_02,(string *)&local_d8,&local_50,&local_70);
      __cxa_throw(this_02,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
    }
    state_00 = unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true>
               ::operator*(&state->constraint_state);
    VerifyUpdateConstraints((DataTable *)state,state_00,context,updates,column_ids);
    Value::BIGINT((Value *)local_158,0x7ffffffffff080);
    Vector::Vector(&local_d8,(Value *)local_158);
    Value::~Value((Value *)local_158);
    LogicalType::LogicalType(&local_1b0,BIGINT);
    Vector::Vector((Vector *)local_158,&local_1b0,0x800);
    LogicalType::~LogicalType(&local_1b0);
    DataChunk::DataChunk(&local_198);
    DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_1e0,updates);
    DataChunk::InitializeEmpty(&local_198,(vector<duckdb::LogicalType,_true> *)&local_1e0);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_1e0);
    SelectionVector::SelectionVector(&local_1e0,iVar2);
    SelectionVector::SelectionVector(&local_1c8,iVar2);
    count_p = VectorOperations::GreaterThanEquals
                        (row_ids,&local_d8,(optional_ptr<const_duckdb::SelectionVector,_true>)0x0,
                         iVar2,&local_1e0,&local_1c8,(optional_ptr<duckdb::ValidityMask,_true>)0x0);
    if (count_p != 0) {
      DataChunk::Slice(&local_198,updates,&local_1e0,count_p,0);
      DataChunk::Flatten(&local_198);
      Vector::Slice((Vector *)local_158,row_ids,&local_1e0,count_p);
      Vector::Flatten((Vector *)local_158,count_p);
      pDVar1 = DuckTransaction::Get(context,this->db);
      this_00 = DuckTransaction::GetLocalStorage(pDVar1);
      LocalStorage::Update(this_00,this,(Vector *)local_158,column_ids,&local_198);
    }
    if (iVar2 != count_p) {
      pDVar1 = DuckTransaction::Get(context,this->db);
      DuckTransaction::ModifyTable(pDVar1,this);
      iVar2 = iVar2 - count_p;
      DataChunk::Slice(&local_198,updates,&local_1c8,iVar2,0);
      DataChunk::Flatten(&local_198);
      Vector::Slice((Vector *)local_158,row_ids,&local_1c8,iVar2);
      Vector::Flatten((Vector *)local_158,iVar2);
      this_01 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
      TransactionData::TransactionData(&local_f0,pDVar1);
      transaction.transaction_id = local_f0.transaction_id;
      transaction.transaction.ptr = local_f0.transaction.ptr;
      transaction.start_time = local_f0.start_time;
      RowGroupCollection::Update
                (this_01,transaction,(row_t *)local_158._32_8_,column_ids,&local_198);
    }
    if (local_1c8.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_1e0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    DataChunk::~DataChunk(&local_198);
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
    }
    if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
    }
    if (local_120._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)(local_158 + 8));
    if (local_d8.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_d8.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType((LogicalType *)((long)&local_d8 + 8));
  }
  return;
}

Assistant:

void DataTable::Update(TableUpdateState &state, ClientContext &context, Vector &row_ids,
                       const vector<PhysicalIndex> &column_ids, DataChunk &updates) {
	D_ASSERT(row_ids.GetType().InternalType() == ROW_TYPE);
	D_ASSERT(column_ids.size() == updates.ColumnCount());
	updates.Verify();

	auto count = updates.size();
	if (count == 0) {
		return;
	}

	if (!IsMainTable()) {
		throw TransactionException(
		    "Transaction conflict: attempting to update table \"%s\" but it has been %s by a different transaction",
		    GetTableName(), TableModification());
	}

	// first verify that no constraints are violated
	VerifyUpdateConstraints(*state.constraint_state, context, updates, column_ids);

	// now perform the actual update
	Vector max_row_id_vec(Value::BIGINT(MAX_ROW_ID));
	Vector row_ids_slice(LogicalType::BIGINT);
	DataChunk updates_slice;
	updates_slice.InitializeEmpty(updates.GetTypes());

	SelectionVector sel_local_update(count), sel_global_update(count);
	auto n_local_update = VectorOperations::GreaterThanEquals(row_ids, max_row_id_vec, nullptr, count,
	                                                          &sel_local_update, &sel_global_update);
	auto n_global_update = count - n_local_update;

	// row id > MAX_ROW_ID? transaction-local storage
	if (n_local_update > 0) {
		updates_slice.Slice(updates, sel_local_update, n_local_update);
		updates_slice.Flatten();
		row_ids_slice.Slice(row_ids, sel_local_update, n_local_update);
		row_ids_slice.Flatten(n_local_update);

		LocalStorage::Get(context, db).Update(*this, row_ids_slice, column_ids, updates_slice);
	}

	// otherwise global storage
	if (n_global_update > 0) {
		auto &transaction = DuckTransaction::Get(context, db);
		transaction.ModifyTable(*this);
		updates_slice.Slice(updates, sel_global_update, n_global_update);
		updates_slice.Flatten();
		row_ids_slice.Slice(row_ids, sel_global_update, n_global_update);
		row_ids_slice.Flatten(n_global_update);

		row_groups->Update(transaction, FlatVector::GetData<row_t>(row_ids_slice), column_ids, updates_slice);
	}
}